

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O1

int mbedtls_asn1_write_raw_buffer(uchar **p,uchar *start,uchar *buf,size_t size)

{
  int iVar1;
  uchar *__dest;
  
  iVar1 = -0x6c;
  if ((long)(int)size <= (long)*p - (long)start) {
    __dest = *p + -size;
    *p = __dest;
    memcpy(__dest,buf,size);
    iVar1 = (int)size;
  }
  return iVar1;
}

Assistant:

int mbedtls_asn1_write_raw_buffer( unsigned char **p, unsigned char *start,
                           const unsigned char *buf, size_t size )
{
    size_t len = 0;

    if( *p - start < (int) size )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    len = size;
    (*p) -= len;
    memcpy( *p, buf, len );

    return( (int) len );
}